

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O3

void density::f_default_construct::invoke<density_tests::Derived2>(void *i_dest)

{
  *(undefined8 *)((long)i_dest + 0x10) = 0;
  *(undefined8 *)((long)i_dest + 0x18) = 0;
  *(undefined8 *)((long)i_dest + 0x20) = 0;
  *(undefined8 *)((long)i_dest + 0x28) = 0;
  *(undefined8 *)i_dest = 0;
  *(undefined8 *)((long)i_dest + 8) = 0;
  *(undefined4 *)((long)i_dest + 0x18) = 0x23;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0x1c));
  *(undefined ***)((long)i_dest + 0x10) = &PTR_class_id_01067338;
  *(undefined8 *)((long)i_dest + 0x20) = 0x4036000000000000;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0x28));
  *(undefined8 *)i_dest = 0x1067540;
  *(undefined8 *)((long)i_dest + 0x10) = 0x1067578;
  *(undefined1 *)((long)i_dest + 8) = 0x16;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 9));
  return;
}

Assistant:

static void invoke(void * i_dest)
        {
            DENSITY_ASSUME(i_dest != nullptr);
            new (i_dest) TARGET_TYPE();
        }